

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_metric.hpp
# Opt level: O3

void __thiscall
ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair::
metric_pair<std::array<std::__cxx11::string,2ul>const&>
          (metric_pair *this,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *first)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  atomic<long> *paVar4;
  undefined8 uVar5;
  bool bVar6;
  
  bVar6 = false;
  lVar3 = 0;
  do {
    *(metric_pair **)(this + lVar3 * 0x20) = this + lVar3 * 0x20 + 0x10;
    pcVar1 = first->_M_elems[lVar3]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(this + lVar3 * 0x20),pcVar1,
               pcVar1 + first->_M_elems[lVar3]._M_string_length);
    lVar3 = 1;
    bVar2 = !bVar6;
    bVar6 = true;
  } while (bVar2);
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  paVar4 = thread_local_value<long>::local_value(dynamic_metric::g_user_metric_label_count);
  LOCK();
  (paVar4->super___atomic_base<long>)._M_i = (paVar4->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  if (ylt_label_max_age != 0) {
    uVar5 = std::chrono::_V2::steady_clock::now();
    *(undefined8 *)(this + 0x48) = uVar5;
  }
  return;
}

Assistant:

metric_pair(T&& first, Args&&... args)
        : label(std::forward<T>(first)), value(std::forward<Args>(args)...) {
      g_user_metric_label_count->inc();
      if (ylt_label_max_age.count()) {
        tp = std::chrono::steady_clock::now();
      }
    }